

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::CuriosityRocker::CuriosityRocker
          (CuriosityRocker *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,int side)

{
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  CuriosityPart::CuriosityPart
            (&this->super_CuriosityPart,name,rel_pos,
             (shared_ptr<chrono::ChMaterialSurface> *)&_Stack_38,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_001a09f0;
  std::__cxx11::string::assign((char *)&(this->super_CuriosityPart).m_mesh_name);
  (this->super_CuriosityPart).m_color.R = 1.0;
  (this->super_CuriosityPart).m_color.G = 0.4;
  (this->super_CuriosityPart).m_color.B = 0.0;
  CuriosityPart::CalcMassProperties(&this->super_CuriosityPart,2000.0);
  return;
}

Assistant:

CuriosityRocker::CuriosityRocker(const std::string& name,
                                 const ChFrame<>& rel_pos,
                                 std::shared_ptr<ChMaterialSurface> mat,
                                 int side)
    : CuriosityPart(name, rel_pos, mat, false) {
    m_mesh_name = (side == 0) ? "curiosity_F_L_arm" : "curiosity_F_R_arm";
    m_color = ChColor(1.0f, 0.4f, 0.0f);

    // Titanium tubing (use an average density)
    CalcMassProperties(2000);
}